

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

sqlite3_int64 sqlite3_memory_highwater(int resetFlag)

{
  sqlite3StatValueType sVar1;
  sqlite3_mutex *psVar2;
  
  psVar2 = mem0.mutex;
  if (mem0.mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(mem0.mutex);
  }
  sVar1 = sqlite3Stat.mxValue[0];
  if (resetFlag != 0) {
    sqlite3Stat.mxValue[0] = sqlite3Stat.nowValue[0];
  }
  if (psVar2 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar2);
  }
  return sVar1;
}

Assistant:

SQLITE_API sqlite3_int64 sqlite3_memory_highwater(int resetFlag){
  sqlite3_int64 res, mx;
  sqlite3_status64(SQLITE_STATUS_MEMORY_USED, &res, &mx, resetFlag);
  return mx;
}